

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_update_fg_62_var
               (int len,secp256k1_modinv64_signed62 *f,secp256k1_modinv64_signed62 *g,
               secp256k1_modinv64_trans2x2 *t)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  secp256k1_modinv64_signed62 *psVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  secp256k1_modinv64_signed62 *b;
  undefined4 in_register_0000003c;
  secp256k1_modinv64_signed62 *a;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  
  a = (secp256k1_modinv64_signed62 *)CONCAT44(in_register_0000003c,len);
  if (len < 1) {
LAB_0014a584:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0014a589:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_0014a58e:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0014a593:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0014a598:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_0014a59d:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar16 = t->u;
    lVar1 = t->v;
    lVar15 = f->v[0];
    lVar13 = g->v[0];
    uVar6 = lVar15 * lVar16;
    lVar11 = SUB168(SEXT816(lVar15) * SEXT816(lVar16),8);
    uVar7 = lVar13 * lVar1;
    lVar12 = SUB168(SEXT816(lVar13) * SEXT816(lVar1),8);
    lVar3 = (0x7fffffffffffffff - lVar12) - lVar11;
    if ((SBORROW8(0x7fffffffffffffff - lVar12,lVar11) != SBORROW8(lVar3,(ulong)(~uVar7 < uVar6))) !=
        (long)(lVar3 - (ulong)(~uVar7 < uVar6)) < 0 && -1 < lVar12) goto LAB_0014a59d;
    lVar3 = t->q;
    lVar2 = t->r;
    lVar12 = lVar12 + lVar11 + (ulong)CARRY8(uVar7,uVar6);
    uVar8 = lVar15 * lVar3;
    lVar11 = SUB168(SEXT816(lVar15) * SEXT816(lVar3),8);
    uVar9 = lVar13 * lVar2;
    lVar13 = SUB168(SEXT816(lVar13) * SEXT816(lVar2),8);
    uVar14 = (ulong)(-uVar9 - 1 < uVar8);
    lVar15 = (0x7fffffffffffffff - lVar13) - lVar11;
    if ((SBORROW8(0x7fffffffffffffff - lVar13,lVar11) != SBORROW8(lVar15,uVar14)) ==
        (long)(lVar15 - uVar14) < 0 || lVar13 < 0) {
      lVar15 = lVar13 + lVar11 + (ulong)CARRY8(uVar9,uVar8);
      if ((uVar7 + uVar6 & 0x3fffffffffffffff) != 0) goto LAB_0014a589;
      if ((uVar9 + uVar8 & 0x3fffffffffffffff) != 0) goto LAB_0014a58e;
      uVar14 = uVar9 + uVar8 >> 0x3e | lVar15 * 4;
      uVar6 = uVar7 + uVar6 >> 0x3e | lVar12 * 4;
      lVar15 = lVar15 >> 0x3e;
      lVar12 = lVar12 >> 0x3e;
      if (len != 1) {
        a = (secp256k1_modinv64_signed62 *)(ulong)(uint)len;
        psVar10 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar13 = f->v[(long)psVar10];
          uVar8 = lVar13 * lVar16 + uVar6;
          lVar17 = SUB168(SEXT816(lVar13) * SEXT816(lVar16),8) + lVar12 +
                   (ulong)CARRY8(lVar13 * lVar16,uVar6);
          lVar11 = g->v[(long)psVar10];
          uVar7 = lVar11 * lVar1;
          lVar12 = SUB168(SEXT816(lVar11) * SEXT816(lVar1),8);
          if (-1 < lVar12) {
            uVar6 = (ulong)(-uVar7 - 1 < uVar8);
            lVar4 = (0x7fffffffffffffff - lVar12) - lVar17;
            if ((SBORROW8(0x7fffffffffffffff - lVar12,lVar17) != SBORROW8(lVar4,uVar6)) ==
                (long)(lVar4 - uVar6) < 0) goto LAB_0014a473;
LAB_0014a57a:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0014a57f:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0014a584;
          }
          lVar18 = (-0x8000000000000000 - lVar12) - (ulong)(uVar7 != 0);
          lVar4 = lVar17 - lVar18;
          if ((SBORROW8(lVar17,lVar18) != SBORROW8(lVar4,(ulong)(uVar8 < -uVar7))) !=
              (long)(lVar4 - (ulong)(uVar8 < -uVar7)) < 0) goto LAB_0014a57a;
LAB_0014a473:
          lVar12 = lVar17 + lVar12 + (ulong)CARRY8(uVar8,uVar7);
          uVar19 = lVar13 * lVar3 + uVar14;
          lVar13 = SUB168(SEXT816(lVar13) * SEXT816(lVar3),8) + lVar15 +
                   (ulong)CARRY8(lVar13 * lVar3,uVar14);
          uVar9 = lVar11 * lVar2;
          lVar15 = SUB168(SEXT816(lVar11) * SEXT816(lVar2),8);
          if (lVar15 < 0) {
            lVar17 = (-0x8000000000000000 - lVar15) - (ulong)(uVar9 != 0);
            lVar11 = lVar13 - lVar17;
            if ((SBORROW8(lVar13,lVar17) != SBORROW8(lVar11,(ulong)(uVar19 < -uVar9))) !=
                (long)(lVar11 - (ulong)(uVar19 < -uVar9)) < 0) goto LAB_0014a57f;
          }
          else {
            uVar6 = (ulong)(-uVar9 - 1 < uVar19);
            lVar11 = (0x7fffffffffffffff - lVar15) - lVar13;
            if ((SBORROW8(0x7fffffffffffffff - lVar15,lVar13) != SBORROW8(lVar11,uVar6)) !=
                (long)(lVar11 - uVar6) < 0) goto LAB_0014a57f;
          }
          lVar15 = lVar13 + lVar15 + (ulong)CARRY8(uVar19,uVar9);
          uVar6 = lVar12 * 4 | uVar8 + uVar7 >> 0x3e;
          f->v[(long)((long)psVar10[-1].v + 0x27)] = uVar8 + uVar7 & 0x3fffffffffffffff;
          uVar14 = lVar15 * 4 | uVar19 + uVar9 >> 0x3e;
          g->v[(long)((long)psVar10[-1].v + 0x27)] = uVar19 + uVar9 & 0x3fffffffffffffff;
          psVar10 = (secp256k1_modinv64_signed62 *)((long)psVar10->v + 1);
          lVar15 = lVar15 >> 0x3e;
          lVar12 = lVar12 >> 0x3e;
        } while (a != psVar10);
      }
      if (lVar12 + -1 + (ulong)(0x7fffffffffffffff < uVar6) != -1) goto LAB_0014a593;
      f->v[(long)len + -1] = uVar6;
      if (lVar15 + -1 + (ulong)(0x7fffffffffffffff < uVar14) == -1) {
        g->v[(long)len + -1] = uVar14;
        return;
      }
      goto LAB_0014a598;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar16 = a->v[0];
  lVar1 = a->v[1];
  lVar15 = a->v[2];
  lVar13 = a->v[3];
  lVar3 = a->v[4];
  lVar11 = 0;
  do {
    if (a->v[lVar11] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014a7d3:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0014a7d8;
    }
    if (0x3fffffffffffffff < a->v[lVar11]) goto LAB_0014a7d3;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  iVar5 = secp256k1_modinv64_mul_cmp_62(a,5,b,-2);
  if (iVar5 < 1) {
LAB_0014a7d8:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0014a7dd:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014a7e2:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar5 = secp256k1_modinv64_mul_cmp_62(a,5,b,1);
    if (-1 < iVar5) goto LAB_0014a7dd;
    uVar6 = lVar3 >> 0x3f;
    uVar8 = (long)f >> 0x3f;
    uVar7 = ((uVar6 & b->v[0]) + lVar16 ^ uVar8) - uVar8;
    uVar9 = ((long)uVar7 >> 0x3e) + (((uVar6 & b->v[1]) + lVar1 ^ uVar8) - uVar8);
    uVar19 = ((long)uVar9 >> 0x3e) + ((lVar15 + (uVar6 & b->v[2]) ^ uVar8) - uVar8);
    uVar14 = ((long)uVar19 >> 0x3e) + (((uVar6 & b->v[3]) + lVar13 ^ uVar8) - uVar8);
    lVar16 = ((long)uVar14 >> 0x3e) + (((uVar6 & b->v[4]) + lVar3 ^ uVar8) - uVar8);
    uVar8 = lVar16 >> 0x3f;
    uVar6 = (b->v[0] & uVar8) + (uVar7 & 0x3fffffffffffffff);
    uVar9 = ((long)uVar6 >> 0x3e) + (b->v[1] & uVar8) + (uVar9 & 0x3fffffffffffffff);
    uVar7 = ((long)uVar9 >> 0x3e) + (b->v[2] & uVar8) + (uVar19 & 0x3fffffffffffffff);
    uVar14 = ((long)uVar7 >> 0x3e) + (b->v[3] & uVar8) + (uVar14 & 0x3fffffffffffffff);
    uVar8 = (b->v[4] & uVar8) + lVar16 + ((long)uVar14 >> 0x3e);
    a->v[0] = uVar6 & 0x3fffffffffffffff;
    a->v[1] = uVar9 & 0x3fffffffffffffff;
    a->v[2] = uVar7 & 0x3fffffffffffffff;
    a->v[3] = uVar14 & 0x3fffffffffffffff;
    a->v[4] = uVar8;
    if (0x3fffffffffffffff < uVar8) goto LAB_0014a7e2;
    iVar5 = secp256k1_modinv64_mul_cmp_62(a,5,b,0);
    if (-1 < iVar5) {
      iVar5 = secp256k1_modinv64_mul_cmp_62(a,5,b,1);
      if (iVar5 < 0) {
        return;
      }
      goto LAB_0014a7ec;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0014a7ec:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_modinv64_update_fg_62_var(int len, secp256k1_modinv64_signed62 *f, secp256k1_modinv64_signed62 *g, const secp256k1_modinv64_trans2x2 *t) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t fi, gi;
    secp256k1_int128 cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    secp256k1_i128_mul(&cf, u, fi);
    secp256k1_i128_accum_mul(&cf, v, gi);
    secp256k1_i128_mul(&cg, q, fi);
    secp256k1_i128_accum_mul(&cg, r, gi);
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cf) & M62) == 0); secp256k1_i128_rshift(&cf, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&cg) & M62) == 0); secp256k1_i128_rshift(&cg, 62);
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 62 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        secp256k1_i128_accum_mul(&cf, u, fi);
        secp256k1_i128_accum_mul(&cf, v, gi);
        secp256k1_i128_accum_mul(&cg, q, fi);
        secp256k1_i128_accum_mul(&cg, r, gi);
        f->v[i - 1] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
        g->v[i - 1] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = secp256k1_i128_to_i64(&cf);
    g->v[len - 1] = secp256k1_i128_to_i64(&cg);
}